

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeMemoryInit<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *mem_00;
  __index_type *__return_storage_ptr___00;
  undefined1 local_b0 [8];
  MaybeResult<wasm::Name> mem;
  Result<wasm::Name> data;
  size_t reset;
  anon_class_32_4_a44794c9 retry;
  Index pos_local;
  
  retry.reset = (size_t *)((long)&retry.annotations + 4);
  data.val.super__Variant_base<wasm::Name,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = (ctx->in).pos;
  retry.ctx = (ParseDefsCtx *)
              ((long)&data.val.super__Variant_base<wasm::Name,_wasm::Err>.
                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
  reset = (size_t)ctx;
  retry.pos = (Index *)annotations;
  retry.annotations._4_4_ = pos;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_b0,ctx);
  if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    makeMemoryInit<wasm::WATParser::ParseDefsCtx>::anon_class_32_4_a44794c9::operator()
              (__return_storage_ptr__,(anon_class_32_4_a44794c9 *)&reset);
  }
  else {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
    dataidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)__return_storage_ptr___00,ctx);
    if (data.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
      makeMemoryInit<wasm::WATParser::ParseDefsCtx>::anon_class_32_4_a44794c9::operator()
                (__return_storage_ptr__,(anon_class_32_4_a44794c9 *)&reset);
    }
    else {
      mem_00 = local_b0;
      if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
        mem_00 = (__index_type *)0x0;
      }
      if (data.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
        __return_storage_ptr___00 = (__index_type *)0x0;
      }
      ParseDefsCtx::makeMemoryInit
                (__return_storage_ptr__,ctx,retry.annotations._4_4_,annotations,(Name *)mem_00,
                 (IString)*(IString *)__return_storage_ptr___00);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryInit(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the data index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto data = dataidx(ctx);
    CHECK_ERR(data);
    return ctx.makeMemoryInit(pos, annotations, nullptr, *data);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto data = dataidx(ctx);
  if (data.getErr()) {
    return retry();
  }
  return ctx.makeMemoryInit(pos, annotations, mem.getPtr(), *data);
}